

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeMe.hpp
# Opt level: O0

void SerializeMe::SerializeIntoBuffer<std::vector,Point3D,std::allocator<Point3D>>
               (SpanBytes *buffer,vector<Point3D,_std::allocator<Point3D>_> *vect)

{
  vector<Point3D,_std::allocator<Point3D>_> *this;
  bool bVar1;
  size_type sVar2;
  reference value;
  Point3D *v;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Point3D,_std::allocator<Point3D>_> *__range3;
  vector<Point3D,_std::allocator<Point3D>_> *pvStack_18;
  uint32_t num_values;
  vector<Point3D,_std::allocator<Point3D>_> *vect_local;
  SpanBytes *buffer_local;
  
  pvStack_18 = vect;
  vect_local = (vector<Point3D,_std::allocator<Point3D>_> *)buffer;
  sVar2 = std::vector<Point3D,_std::allocator<Point3D>_>::size(vect);
  __range3._4_4_ = (undefined4)sVar2;
  SerializeIntoBuffer<unsigned_int>((SpanBytes *)vect_local,(uint *)((long)&__range3 + 4));
  this = pvStack_18;
  __end0 = std::vector<Point3D,_std::allocator<Point3D>_>::begin(pvStack_18);
  v = (Point3D *)std::vector<Point3D,_std::allocator<Point3D>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Point3D_*,_std::vector<Point3D,_std::allocator<Point3D>_>_>
                                *)&v);
    if (!bVar1) break;
    value = __gnu_cxx::
            __normal_iterator<const_Point3D_*,_std::vector<Point3D,_std::allocator<Point3D>_>_>::
            operator*(&__end0);
    SerializeIntoBuffer<Point3D>((SpanBytes *)vect_local,value);
    __gnu_cxx::__normal_iterator<const_Point3D_*,_std::vector<Point3D,_std::allocator<Point3D>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

inline void SerializeIntoBuffer(SpanBytes& buffer, Container<T, TArgs...> const& vect)
{
  const auto num_values = static_cast<uint32_t>(vect.size());
  SerializeIntoBuffer(buffer, num_values);

  // can use memcpy if the size of T is 1
  if constexpr (sizeof(T) == 1 && is_vector<Container<T, TArgs...>>())
  {
    const size_t size = num_values;
    if (size > buffer.size())
    {
      throw std::runtime_error("SerializeIntoBuffer: buffer overflow");
    }
    memcpy(buffer.data(), vect.data(), size);
    buffer = SpanBytes(buffer.data() + size, buffer.size() - size);
  }
  else
  {
    for (const T& v : vect)
    {
      SerializeIntoBuffer(buffer, v);
    }
  }
}